

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

void handler(int max,int argc,Edge *allEdges)

{
  int iVar1;
  Solution local_a4;
  int local_60;
  undefined1 local_5c [4];
  int state;
  Solution my_solution;
  Edge *allEdges_local;
  int argc_local;
  int max_local;
  
  my_solution._60_8_ = allEdges;
  do {
    local_60 = get_state();
    if (local_60 < 1) {
      if (local_60 == 0) {
        return;
      }
      fprintf(_stderr,"%s ERROR: couldn\'t fetch program state\n",name);
      exit(1);
    }
    calculate_one_solution(&local_a4,argc,(Edge *)my_solution._60_8_,max);
    memcpy(local_5c,&local_a4,0x44);
  } while ((my_solution.edges[7].start < 0) ||
          (iVar1 = circ_buf_write((Solution *)local_5c), iVar1 == 0));
  fprintf(_stderr,"%s ERROR: error writing to shared memory\n",name);
  exit(1);
}

Assistant:

static void handler(const int max, const int argc, const Edge *allEdges)
{
	Solution my_solution;

	int state;
	while ((state = get_state()) > 0)
	{

		my_solution = calculate_one_solution(argc, allEdges, max);

		if (my_solution.amount < 0)
		{
#ifdef DEBUG
			fprintf(stdout, "Solution too Big\n");
#endif 
		}
		else
		{
#ifdef DEBUG
			printEdge(my_solution.edges, my_solution.amount);
#endif
			if (circ_buf_write(&my_solution) != 0)
			{
				ERROR_EXIT("error writing to shared memory");
			}
		}
	}
	if (state != 0)
	{
		ERROR_EXIT("couldn't fetch program state");
	}
}